

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_poll.cpp
# Opt level: O3

void * poll_routine(void *arg)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  stCoRoutine_t *psVar7;
  uint *puVar8;
  char *pcVar9;
  pollfd *__fds;
  long lVar10;
  size_t sVar11;
  int *piVar12;
  long lVar13;
  size_t __size;
  _Rb_tree_header *p_Var14;
  _Base_ptr p_Var15;
  ulong uVar16;
  long lVar17;
  _Base_ptr p_Var18;
  nfds_t __nfds;
  pollfd *__v;
  set<int,_std::less<int>,_std::allocator<int>_> setRaiseFds;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  co_enable_hook_sys();
  lVar10 = *arg;
  if (*(long *)((long)arg + 8) == lVar10) {
    __nfds = 0;
    __size = 0;
  }
  else {
    lVar17 = 0xc;
    uVar16 = 0;
    do {
      iVar4 = socket(2,1,6);
      uVar5 = fcntl(iVar4,3,0);
      fcntl(iVar4,4,(ulong)(uVar5 | 0x800));
      lVar10 = *arg;
      *(int *)(lVar10 + -4 + lVar17) = iVar4;
      uVar6 = connect(iVar4,(sockaddr *)(lVar10 + lVar17),0x10);
      psVar7 = co_self();
      puVar8 = (uint *)__errno_location();
      uVar5 = *puVar8;
      pcVar9 = strerror(uVar5);
      printf("co %p connect i %ld ret %d errno %d (%s)\n",psVar7,uVar16,(ulong)uVar6,(ulong)uVar5,
             pcVar9);
      uVar16 = uVar16 + 1;
      lVar10 = *arg;
      lVar13 = *(long *)((long)arg + 8) - lVar10;
      __nfds = lVar13 >> 5;
      lVar17 = lVar17 + 0x20;
    } while (uVar16 < __nfds);
    __size = lVar13 >> 2;
  }
  __fds = (pollfd *)calloc(1,__size);
  if (__nfds != 0) {
    piVar12 = (int *)(lVar10 + 8);
    uVar16 = 0;
    do {
      __fds[uVar16].fd = *piVar12;
      __fds[uVar16].events = 0x1c;
      uVar16 = uVar16 + 1;
      piVar12 = piVar12 + 8;
    } while (__nfds != uVar16);
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  do {
    uVar5 = poll(__fds,__nfds,1000);
    psVar7 = co_self();
    printf("co %p poll wait %ld ret %d\n",psVar7,__nfds,(ulong)uVar5);
    if (0 < (int)(uint)__nfds) {
      uVar16 = (ulong)((uint)__nfds & 0x7fffffff);
      __v = __fds;
      do {
        psVar7 = co_self();
        printf("co %p fire fd %d revents 0x%X POLLOUT 0x%X POLLERR 0x%X POLLHUP 0x%X\n",psVar7,
               (ulong)(uint)__v->fd,(ulong)(uint)(int)__v->revents,4,8,0x10);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &local_60,&__v->fd);
        __v = __v + 1;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    lVar10 = *arg;
    lVar17 = *(long *)((long)arg + 8);
    sVar11 = lVar17 - lVar10 >> 5;
    if (0 >= (int)uVar5 || local_60._M_impl.super__Rb_tree_header._M_node_count == sVar11) break;
    if (lVar17 == lVar10) {
      __nfds = 0;
    }
    else {
      lVar13 = 0;
      __nfds = 0;
      do {
        piVar12 = (int *)(lVar13 * 0x20 + lVar10 + 8);
        if (local_60._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
          iVar4 = *piVar12;
LAB_00103a7b:
          __fds[__nfds].fd = iVar4;
          __fds[__nfds].events = 0x1c;
          __nfds = __nfds + 1;
        }
        else {
          iVar4 = *piVar12;
          p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var15 = &p_Var1->_M_header;
          do {
            p_Var14 = (_Rb_tree_header *)p_Var15;
            p_Var18 = p_Var3;
            iVar2 = (int)*(size_t *)(p_Var18 + 1);
            p_Var15 = p_Var18;
            if (iVar2 < iVar4) {
              p_Var15 = &p_Var14->_M_header;
            }
            p_Var3 = (&p_Var18->_M_left)[iVar2 < iVar4];
          } while ((&p_Var18->_M_left)[iVar2 < iVar4] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var15 == p_Var1) goto LAB_00103a7b;
          if (iVar2 < iVar4) {
            p_Var18 = &p_Var14->_M_header;
          }
          if (iVar4 < (int)((_Rb_tree_header *)p_Var18)->_M_node_count) goto LAB_00103a7b;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != sVar11 + (sVar11 == 0));
    }
  } while (0 < (int)uVar5 && local_60._M_impl.super__Rb_tree_header._M_node_count != sVar11);
  if (lVar17 != lVar10) {
    lVar17 = 8;
    uVar16 = 0;
    do {
      close(*(int *)(lVar10 + lVar17));
      lVar10 = *arg;
      *(undefined4 *)(lVar10 + lVar17) = 0xffffffff;
      uVar16 = uVar16 + 1;
      lVar17 = lVar17 + 0x20;
    } while (uVar16 < (ulong)(*(long *)((long)arg + 8) - lVar10 >> 5));
  }
  psVar7 = co_self();
  printf("co %p task cnt %ld fire %ld\n",psVar7,*(long *)((long)arg + 8) - *arg >> 5,
         local_60._M_impl.super__Rb_tree_header._M_node_count);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return (void *)0x0;
}

Assistant:

static void *poll_routine( void *arg )
{
	co_enable_hook_sys();

	vector<task_t> &v = *(vector<task_t>*)arg;
	for(size_t i=0;i<v.size();i++)
	{
		int fd = CreateTcpSocket();
		SetNonBlock( fd );
		v[i].fd = fd;

		int ret = connect(fd,(struct sockaddr*)&v[i].addr,sizeof( v[i].addr )); 
		printf("co %p connect i %ld ret %d errno %d (%s)\n",
			co_self(),i,ret,errno,strerror(errno));
	}
	struct pollfd *pf = (struct pollfd*)calloc( 1,sizeof(struct pollfd) * v.size() );

	for(size_t i=0;i<v.size();i++)
	{
		pf[i].fd = v[i].fd;
		pf[i].events = ( POLLOUT | POLLERR | POLLHUP );
	}
	set<int> setRaiseFds;
	size_t iWaitCnt = v.size();
	for(;;)
	{
		int ret = poll( pf,iWaitCnt,1000 );
		printf("co %p poll wait %ld ret %d\n",
				co_self(),iWaitCnt,ret);
		for(int i=0;i<(int)iWaitCnt;i++)
		{
			printf("co %p fire fd %d revents 0x%X POLLOUT 0x%X POLLERR 0x%X POLLHUP 0x%X\n",
					co_self(),
					pf[i].fd,
					pf[i].revents,
					POLLOUT,
					POLLERR,
					POLLHUP
					);
			setRaiseFds.insert( pf[i].fd );
		}
		if( setRaiseFds.size() == v.size())
		{
			break;
		}
		if( ret <= 0 )
		{
			break;
		}

		iWaitCnt = 0;
		for(size_t i=0;i<v.size();i++)
		{
			if( setRaiseFds.find( v[i].fd ) == setRaiseFds.end() )
			{
				pf[ iWaitCnt ].fd = v[i].fd;
				pf[ iWaitCnt ].events = ( POLLOUT | POLLERR | POLLHUP );
				++iWaitCnt;
			}
		}
	}
	for(size_t i=0;i<v.size();i++)
	{
		close( v[i].fd );
		v[i].fd = -1;
	}

	printf("co %p task cnt %ld fire %ld\n",
			co_self(),v.size(),setRaiseFds.size() );
	return 0;
}